

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O3

int sign_frommemory(LIBSSH2_SESSION *session,uchar **sig,size_t *sig_len,uchar *data,size_t data_len
                   ,void **abstract)

{
  undefined8 *puVar1;
  uchar *__s2;
  size_t __n;
  _func_int_LIBSSH2_SESSION_ptr_char_ptr_size_t_uchar_ptr_void_ptr_ptr *p_Var2;
  int iVar3;
  LIBSSH2_HOSTKEY_METHOD **ppLVar4;
  LIBSSH2_HOSTKEY_METHOD *pLVar5;
  void *hostkey_abstract;
  iovec datavec;
  void *local_80;
  uchar *local_78;
  size_t local_70;
  char *local_68;
  uchar *local_60;
  size_t local_58;
  uchar **local_50;
  size_t *local_48;
  iovec local_40;
  
  puVar1 = (undefined8 *)*abstract;
  __s2 = session->userauth_pblc_method;
  __n = session->userauth_pblc_method_len;
  local_68 = (char *)*puVar1;
  local_60 = data;
  local_58 = data_len;
  local_50 = sig;
  local_48 = sig_len;
  local_70 = strlen(local_68);
  local_78 = (uchar *)puVar1[1];
  ppLVar4 = libssh2_hostkey_methods();
  local_80 = (void *)0x0;
  pLVar5 = *ppLVar4;
  while (pLVar5 != (LIBSSH2_HOSTKEY_METHOD *)0x0) {
    ppLVar4 = ppLVar4 + 1;
    if (pLVar5->name == (char *)0x0) break;
    p_Var2 = pLVar5->initPEMFromMemory;
    if ((p_Var2 != (_func_int_LIBSSH2_SESSION_ptr_char_ptr_size_t_uchar_ptr_void_ptr_ptr *)0x0) &&
       (iVar3 = strncmp(pLVar5->name,(char *)__s2,__n), iVar3 == 0)) {
      iVar3 = (*p_Var2)(session,local_68,local_70,local_78,&local_80);
      if (iVar3 == 0) goto LAB_0012af04;
      iVar3 = _libssh2_error(session,-0x10,"Unable to initialize private key from memory");
      goto LAB_0012af00;
    }
    pLVar5 = *ppLVar4;
  }
  iVar3 = _libssh2_error(session,-0x11,"No handler for specified private key");
  pLVar5 = (LIBSSH2_HOSTKEY_METHOD *)0x0;
LAB_0012af00:
  if (iVar3 == 0) {
LAB_0012af04:
    local_40.iov_base = local_60;
    local_40.iov_len = local_58;
    iVar3 = (*pLVar5->signv)(session,local_50,local_48,1,&local_40,&local_80);
    iVar3 = -(uint)(iVar3 != 0);
    if (pLVar5->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
      (*pLVar5->dtor)(session,&local_80);
    }
  }
  return iVar3;
}

Assistant:

static int
sign_frommemory(LIBSSH2_SESSION *session, unsigned char **sig, size_t *sig_len,
                const unsigned char *data, size_t data_len, void **abstract)
{
    struct privkey_file *pk_file = (struct privkey_file *) (*abstract);
    const LIBSSH2_HOSTKEY_METHOD *privkeyobj;
    void *hostkey_abstract;
    struct iovec datavec;
    int rc;

    rc = memory_read_privatekey(session, &privkeyobj, &hostkey_abstract,
                                session->userauth_pblc_method,
                                session->userauth_pblc_method_len,
                                pk_file->filename,
                                strlen(pk_file->filename),
                                pk_file->passphrase);
    if(rc)
        return rc;

    libssh2_prepare_iovec(&datavec, 1);
    datavec.iov_base = (void *)data;
    datavec.iov_len  = data_len;

    if(privkeyobj->signv(session, sig, sig_len, 1, &datavec,
                         &hostkey_abstract)) {
        if(privkeyobj->dtor) {
            privkeyobj->dtor(session, &hostkey_abstract);
        }
        return -1;
    }

    if(privkeyobj->dtor) {
        privkeyobj->dtor(session, &hostkey_abstract);
    }
    return 0;
}